

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Superposition.cpp
# Opt level: O2

Clause * __thiscall
Inferences::Superposition::performSuperposition
          (Superposition *this,Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
          Literal *eqLit,TermList eqLHS,AbstractingUnifier *unifier,bool eqIsResult)

{
  PassiveClauseContainer *passiveClauseContainer;
  PartialRedundancyHandler *pPVar1;
  Ordering *this_00;
  _Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false> _Var2;
  uint numPositiveLiteralsLowerBound;
  Self SVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Result RVar9;
  uint uVar10;
  SaturationAlgorithm *pSVar11;
  TermList trm;
  Literal *pLVar12;
  TermList arg1_00;
  Literal *pLVar13;
  undefined8 extraout_RAX;
  Literal *lit;
  undefined8 uVar14;
  undefined8 uVar15;
  AnswerLiteralManager *pAVar16;
  undefined4 extraout_var;
  Clause *unit;
  InferenceExtra *extra;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  RefIterator it;
  bool andThatsIt;
  undefined4 local_17c;
  Literal *local_178;
  TermList local_170;
  Literal *local_168;
  ulong local_160;
  Clause *local_158;
  ResultSubstitutionSP subst;
  long local_118;
  Destroyer inf_destroyer;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> res;
  TermList arg1;
  ResultSubstitutionSP local_b8;
  Literal *local_a8;
  TermList local_a0;
  Inference inf;
  Inference local_68;
  
  Indexing::ResultSubstitution::fromSubstitution
            ((ResultSubstitution *)&subst,
             (RobSubstitution *)
             (unifier->_subs)._self._M_t.
             super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
             .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>,0,1);
  local_a0 = Kernel::SortHelper::getEqualityArgumentSort(eqLit);
  if ((((eqLHS._content & 1) != 0) &&
      (bVar4 = checkSuperpositionFromVariable(eqClause,eqLit,eqLHS), !bVar4)) ||
     (bVar4 = checkClauseColorCompatibility(this,eqClause,rwClause), !bVar4)) {
    unit = (Clause *)0x0;
    goto LAB_0041a0e5;
  }
  local_178 = *(Literal **)&rwClause->field_0x38;
  uVar14 = *(undefined8 *)&eqClause->field_0x38;
  local_170 = Kernel::EqHelper::getOtherEqualitySide(eqLit,eqLHS);
  uVar6 = Kernel::Clause::numPositiveLiterals(eqClause);
  uVar7 = Kernel::Clause::numPositiveLiterals(rwClause);
  numPositiveLiteralsLowerBound = uVar6 - 1;
  if ((int)(uVar6 - 1) <= (int)uVar7) {
    numPositiveLiteralsLowerBound = uVar7;
  }
  res._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
       (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
        )(CONCAT71(res._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl._1_7_
                   ,((unifier->_uwa)._mode != OFF) * '\x02') | 0x3c);
  res._8_8_ = rwClause;
  Kernel::Inference::Inference(&inf,(GeneratingInference2 *)&res);
  passiveClauseContainer =
       (((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
         super_InferenceEngine._salg)->_passive)._M_t.
       super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
       ._M_t.
       super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
       .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl;
  andThatsIt = false;
  local_160 = (ulong)eqIsResult;
  inf_destroyer._destroyee = &inf;
  if ((passiveClauseContainer == (PassiveClauseContainer *)0x0) ||
     (cVar5 = (**(code **)(*(long *)&(passiveClauseContainer->super_RandomAccessClauseContainer).
                                     super_ClauseContainer + 0x78))(), cVar5 == '\0')) {
LAB_00419bc1:
    local_17c = 0;
LAB_00419bc9:
    pSVar11 = (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
              super_InferenceEngine._salg;
    pPVar1 = (pSVar11->_partialRedundancyHandler)._M_t.
             super___uniq_ptr_impl<Shell::PartialRedundancyHandler,_std::default_delete<Shell::PartialRedundancyHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_Shell::PartialRedundancyHandler_*,_std::default_delete<Shell::PartialRedundancyHandler>_>
             .super__Head_base<0UL,_Shell::PartialRedundancyHandler_*,_false>._M_head_impl;
    if ((unifier->_uwa)._mode == OFF) {
      iVar8 = (*pPVar1->_vptr_PartialRedundancyHandler[2])
                        (pPVar1,eqClause,eqLit,rwClause,rwLit,local_160);
      if ((char)iVar8 == '\0') goto LAB_0041a0d6;
      pSVar11 = (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                super_InferenceEngine._salg;
    }
    this_00 = (pSVar11->_ordering)._obj;
    lVar19 = 0x10;
    if (eqIsResult) {
      lVar19 = 0x28;
    }
    local_158 = eqClause;
    local_170._content =
         (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar19))
                   (subst._obj,local_170._content);
    local_118 = 0x18;
    lVar18 = 0x30;
    if (eqIsResult) {
      lVar18 = 0x18;
    }
    local_168 = (Literal *)
                (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar18))
                          (subst._obj,rwLit);
    lVar17 = 0x28;
    if (eqIsResult) {
      lVar17 = 0x10;
    }
    trm._content = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar17))
                             (subst._obj,rwTerm._content);
    uVar6 = (*this_00->_vptr_Ordering[3])(this_00,local_170._content);
    if ((uVar6 & 0xfffffffd) != 1) {
      if ((local_168->super_Term)._functor == 0) {
        uVar20 = (ulong)(*(uint *)&(local_168->super_Term).field_0xc & 0xfffffff);
        res._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )(local_168->super_Term)._args[uVar20]._content;
        arg1._content = (local_168->super_Term)._args[uVar20 - 1]._content;
        bVar4 = Kernel::TermList::containsSubterm((TermList *)&res,trm);
        if (bVar4) {
          bVar4 = Kernel::TermList::containsSubterm(&arg1,trm);
          if (!bVar4) {
            RVar9 = Kernel::Ordering::getEqualityArgumentOrder(this_00,local_168);
            if (RVar9 - EQUAL < 2) {
              if ((RVar9 & ~LESS) != GREATER) goto LAB_00419cf8;
            }
            else if (RVar9 == GREATER) goto LAB_00419cf8;
            goto LAB_0041a0d6;
          }
        }
        else {
          RVar9 = Kernel::Ordering::getEqualityArgumentOrder(this_00,local_168);
          if ((RVar9 & ~LESS) == GREATER) goto LAB_0041a0d6;
        }
      }
LAB_00419cf8:
      if ((unifier->_uwa)._mode == OFF) {
        (*pPVar1->_vptr_PartialRedundancyHandler[3])
                  (pPVar1,local_158,rwClause,trm._content,local_170._content,eqLHS._content,
                   local_168,eqLit,(ulong)uVar6,local_160,subst._obj);
      }
      pLVar12 = Kernel::EqHelper::replace(local_168,trm,local_170);
      if ((performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
           ::doSimS == '\0') &&
         (iVar8 = __cxa_guard_acquire(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                                       ::doSimS), iVar8 != 0)) {
        iVar8 = (*(this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                  super_InferenceEngine._vptr_InferenceEngine[4])(this);
        performSuperposition::doSimS = *(bool *)(CONCAT44(extraout_var_00,iVar8) + 0x49da);
        __cxa_guard_release(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                             ::doSimS);
      }
      bVar4 = Kernel::EqHelper::isEqTautology(pLVar12);
      if (!bVar4) {
        arg1_00._content =
             (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar19))
                       (subst._obj,eqLHS._content);
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        Recycled(&res);
        uVar6 = (uint)uVar14;
        _Var2._M_head_impl =
             (unifier->_constr)._self._M_t.
             super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
             .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
        Lib::Stack<Kernel::Literal_*>::reserve
                  ((Stack<Kernel::Literal_*> *)
                   res._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                   (ulong)(((int)(((long)((_Var2._M_head_impl)->_cont)._cursor -
                                  (long)((_Var2._M_head_impl)->_cont)._stack) / 0x30) +
                           (uVar6 & 0xfffff) + ((uint)local_178 & 0xfffff)) - 1));
        if (*(int *)(Lib::env + 0x8898) == 2) {
          pLVar13 = Kernel::Clause::getAnswerLiteral(rwClause);
          local_a8 = Kernel::Clause::getAnswerLiteral(local_158);
        }
        else {
          pLVar13 = (Literal *)0x0;
          local_a8 = (Literal *)0x0;
        }
        bVar4 = local_a8 != (Literal *)0x0;
        local_160._0_1_ = pLVar13 != (Literal *)0x0;
        if ((performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
             ::afterCheck == '\0') &&
           (iVar8 = __cxa_guard_acquire(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                                         ::afterCheck), iVar8 != 0)) {
          iVar8 = (*(this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                    super_InferenceEngine._vptr_InferenceEngine[4])(this);
          if (*(char *)(CONCAT44(extraout_var_01,iVar8) + 0x1502) == '\x01') {
            iVar8 = (*((((this->super_GeneratingInferenceEngine).
                         super_SimplifyingGeneratingInference.super_InferenceEngine._salg)->
                       _selector)._obj)->_vptr_LiteralSelector[2])();
            performSuperposition::afterCheck = SUB41(iVar8,0);
          }
          else {
            performSuperposition::afterCheck = false;
          }
          __cxa_guard_release(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                               ::afterCheck);
        }
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)
                   res._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                   pLVar12);
        local_160 = CONCAT71(local_160._1_7_,(byte)local_160 & bVar4);
        uVar7 = (pLVar12->super_Term)._weight;
        local_178 = (Literal *)(ulong)((uint)local_178 & 0xfffff);
        unit = (Clause *)0x0;
        for (pLVar12 = (Literal *)0x0; local_178 != pLVar12;
            pLVar12 = (Literal *)((long)&(pLVar12->super_Term)._vptr_Term + 1)) {
          if ((rwClause->_literals[(long)pLVar12] != rwLit) &&
             ((rwClause->_literals[(long)pLVar12] == pLVar13 & (byte)local_160) == 0)) {
            lit = (Literal *)(**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar18))();
            if (performSuperposition::doSimS == true) {
              lit = Kernel::EqHelper::replace(lit,trm,local_170);
            }
            bVar4 = Kernel::EqHelper::isEqTautology(lit);
            if (bVar4) goto LAB_0041a455;
            if ((char)local_17c != '\0') {
              uVar7 = uVar7 + (lit->super_Term)._weight;
              cVar5 = (**(code **)(*(long *)&(passiveClauseContainer->
                                             super_RandomAccessClauseContainer).
                                             super_ClauseContainer + 0x88))
                                (passiveClauseContainer,uVar7,numPositiveLiteralsLowerBound,&inf);
              if (cVar5 != '\0') goto LAB_0041a311;
            }
            if (((performSuperposition::afterCheck == true) &&
                (pLVar12 < (Literal *)(ulong)(*(uint *)&rwClause->field_0x3c & 0xfffff))) &&
               (iVar8 = (*this_00->_vptr_Ordering[2])(this_00,lit,local_168), iVar8 == 1))
            goto LAB_0041a353;
            Lib::Stack<Kernel::Literal_*>::push
                      ((Stack<Kernel::Literal_*> *)
                       res._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                       lit);
          }
        }
        if (performSuperposition::afterCheck == true) {
          if ((*(uint *)&local_158->field_0x3b & 0xffffe00) == 0) {
            local_178 = (Literal *)0x0;
          }
          else {
            local_178 = Kernel::Literal::createEquality(true,arg1_00,local_170,local_a0);
          }
        }
        else {
          local_178 = (Literal *)0x0;
        }
        if (eqIsResult) {
          local_118 = 0x30;
        }
        unit = (Clause *)0x0;
        for (uVar20 = 0;
            SVar3._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                 res._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
            (uVar6 & 0xfffff) != uVar20; uVar20 = uVar20 + 1) {
          if (local_158->_literals[uVar20] != eqLit) {
            pLVar12 = (Literal *)
                      (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + local_118))();
            bVar4 = Kernel::EqHelper::isEqTautology(pLVar12);
            if (bVar4) goto LAB_0041a455;
            if ((char)local_17c != '\0') {
              uVar7 = uVar7 + (pLVar12->super_Term)._weight;
              cVar5 = (**(code **)(*(long *)&(passiveClauseContainer->
                                             super_RandomAccessClauseContainer).
                                             super_ClauseContainer + 0x88))
                                (passiveClauseContainer,uVar7,numPositiveLiteralsLowerBound,&inf);
              if (cVar5 != '\0') goto LAB_0041a311;
            }
            if (((local_178 != (Literal *)0x0) &&
                (uVar20 < (*(uint *)&local_158->field_0x3c & 0xfffff))) &&
               (uVar10 = (*this_00->_vptr_Ordering[2])(this_00,pLVar12,local_178),
               (uVar10 & 0xfffffffd) == 1)) goto LAB_0041a353;
            Lib::Stack<Kernel::Literal_*>::push
                      ((Stack<Kernel::Literal_*> *)
                       res._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                       pLVar12);
          }
        }
        Kernel::AbstractingUnifier::computeConstraintLiterals
                  ((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)&arg1,unifier);
        it._stack = (Stack<Kernel::Literal_*> *)arg1._content;
        it._pointer = *(Literal ***)(arg1._content + 0x10);
        Lib::Stack<Kernel::Literal*>::loadFromIterator<Lib::Stack<Kernel::Literal*>::RefIterator>
                  ((Stack<Kernel::Literal*> *)
                   SVar3._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,it);
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&arg1);
        if ((byte)local_160 != '\0') {
          uVar14 = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar18))
                             (subst._obj,pLVar13);
          local_178 = (Literal *)
                      (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + local_118))
                                (subst._obj,local_a8);
          uVar15 = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + local_118))
                             (subst._obj,eqLit);
          SVar3 = res._self;
          pAVar16 = Shell::AnswerLiteralManager::getInstance();
          iVar8 = (*pAVar16->_vptr_AnswerLiteralManager[5])(pAVar16,uVar15,uVar14,local_178);
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)
                     SVar3._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                     (Literal *)CONCAT44(extraout_var,iVar8));
        }
        if (((char)local_17c != '\0') &&
           (cVar5 = (**(code **)(*(long *)&(passiveClauseContainer->
                                           super_RandomAccessClauseContainer).super_ClauseContainer
                                + 0x88))
                              (passiveClauseContainer,uVar7,numPositiveLiteralsLowerBound,&inf),
           cVar5 != '\0')) {
LAB_0041a311:
          *(int *)(DAT_00a141a0 + 0x1e4) = *(int *)(DAT_00a141a0 + 0x1e4) + 1;
          goto LAB_0041a364;
        }
        if ((unifier->_uwa)._mode == OFF) {
          if (rwClause == local_158) {
            *(int *)(DAT_00a141a0 + 0x4c) = *(int *)(DAT_00a141a0 + 0x4c) + 1;
          }
          else if (eqIsResult) {
            *(int *)(DAT_00a141a0 + 0x44) = *(int *)(DAT_00a141a0 + 0x44) + 1;
          }
          else {
            *(int *)(DAT_00a141a0 + 0x48) = *(int *)(DAT_00a141a0 + 0x48) + 1;
          }
        }
        else if (rwClause == local_158) {
          *(int *)(DAT_00a141a0 + 0x50) = *(int *)(DAT_00a141a0 + 0x50) + 1;
        }
        else if (eqIsResult) {
          *(int *)(DAT_00a141a0 + 0x54) = *(int *)(DAT_00a141a0 + 0x54) + 1;
        }
        else {
          *(int *)(DAT_00a141a0 + 0x58) = *(int *)(DAT_00a141a0 + 0x58) + 1;
        }
        inf_destroyer._destroyee = (Inference *)0x0;
        local_68._0_8_ = inf._0_8_;
        local_68._8_4_ = inf._8_4_;
        local_68._age = inf._age;
        local_68._splits = inf._splits;
        local_68._ptr1 = inf._ptr1;
        local_68._ptr2 = inf._ptr2;
        local_68.th_ancestors = inf.th_ancestors;
        local_68.all_ancestors = inf.all_ancestors;
        unit = Kernel::Clause::fromStack
                         ((Stack<Kernel::Literal_*> *)
                          res._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl,&local_68);
        if (*(int *)(Lib::env + 0x85a8) == 2) {
          extra = (InferenceExtra *)::operator_new(0x40);
          extra->_vptr_InferenceExtra = (_func_int **)&PTR__TwoLiteralRewriteInferenceExtra_009fc6a8
          ;
          extra[1]._vptr_InferenceExtra = (_func_int **)&PTR__TwoLiteralInferenceExtra_009fc628;
          extra[2]._vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_009fc5e8;
          extra[3]._vptr_InferenceExtra = (_func_int **)rwLit;
          extra[4]._vptr_InferenceExtra = (_func_int **)eqLit;
          extra[5]._vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_009fc668;
          extra[6]._vptr_InferenceExtra = (_func_int **)eqLHS._content;
          extra[7]._vptr_InferenceExtra = (_func_int **)rwTerm._content;
          Lib::ProofExtra::insert((ProofExtra *)&DAT_00a141b8,&unit->super_Unit,extra);
        }
        goto LAB_0041a455;
      }
    }
  }
  else {
    cVar5 = (**(code **)(*(long *)&(passiveClauseContainer->super_RandomAccessClauseContainer).
                                   super_ClauseContainer + 0x80))
                      (passiveClauseContainer,numPositiveLiteralsLowerBound,&inf,&andThatsIt);
    if (cVar5 == '\0') goto LAB_00419bc1;
    if (andThatsIt != true) {
      local_b8._obj = subst._obj;
      local_b8._refCnt = subst._refCnt;
      if (subst._refCnt != (RefCounter *)0x0 && subst._obj != (ResultSubstitution *)0x0) {
        (subst._refCnt)->_val = (subst._refCnt)->_val + 1;
      }
      bVar4 = earlyWeightLimitCheck
                        (eqClause,eqLit,rwClause,rwLit,rwTerm,eqLHS,local_170,&local_b8,
                         SUB81(local_160,0),passiveClauseContainer,numPositiveLiteralsLowerBound,
                         &inf);
      Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&local_b8);
      local_17c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      if (!bVar4) goto LAB_0041a0d6;
      goto LAB_00419bc9;
    }
    *(int *)(DAT_00a141a0 + 0x1e4) = *(int *)(DAT_00a141a0 + 0x1e4) + 1;
  }
LAB_0041a0d6:
  unit = (Clause *)0x0;
LAB_0041a0d8:
  Kernel::Inference::Destroyer::~Destroyer(&inf_destroyer);
LAB_0041a0e5:
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&subst);
  return unit;
LAB_0041a353:
  *(int *)(DAT_00a141a0 + 0x1e8) = *(int *)(DAT_00a141a0 + 0x1e8) + 1;
LAB_0041a364:
  unit = (Clause *)0x0;
LAB_0041a455:
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&res);
  goto LAB_0041a0d8;
}

Assistant:

Clause* Superposition::performSuperposition(
    Clause* rwClause, Literal* rwLit, TermList rwTerm,
    Clause* eqClause, Literal* eqLit, TermList eqLHS,
    AbstractingUnifier* unifier, bool eqIsResult)
{
  TIME_TRACE("perform superposition");
  // we want the rwClause and eqClause to be active
  ASS(rwClause->store()==Clause::ACTIVE);
  ASS(eqClause->store()==Clause::ACTIVE);

  // the first checks the reference and the second checks the stack
  auto subst = ResultSubstitution::fromSubstitution(&unifier->subs(), RetrievalAlgorithms::DefaultVarBanks::query, RetrievalAlgorithms::DefaultVarBanks::internal);
  TermList eqLHSsort = SortHelper::getEqualityArgumentSort(eqLit);

  if(eqLHS.isVar()) {
    if(!checkSuperpositionFromVariable(eqClause, eqLit, eqLHS)) {
      return 0;
    }
  }

  if(!checkClauseColorCompatibility(eqClause, rwClause)) {
    return 0;
  }

  unsigned rwLength = rwClause->length();
  unsigned eqLength = eqClause->length();

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLit, eqLHS);

  // LRS-specific optimization:
  // check whether we can conclude that the resulting clause will be discarded by LRS since it does not fulfil the age/weight limits (in which case we can discard the clause)
  // we already know the age here so we can immediately conclude whether the clause fulfils the age limit
  // since we have not built the clause yet we compute lower bounds on the weight of the clause after each step and recheck whether the weight-limit can still be fulfilled.

  unsigned numPositiveLiteralsLowerBound = Int::max(eqClause->numPositiveLiterals()-1, rwClause->numPositiveLiterals()); // lower bound on number of positive literals, don't know at this point whether duplicate positive literals will occur
  //TODO update inference rule name AYB
  Inference inf(GeneratingInference2(unifier->usesUwa() ? InferenceRule::CONSTRAINED_SUPERPOSITION : InferenceRule::SUPERPOSITION, rwClause, eqClause));
  Inference::Destroyer inf_destroyer(inf);

  auto passiveClauseContainer = _salg->getPassiveClauseContainer();
  bool andThatsIt = false;
  bool hasAgeLimitStrike = passiveClauseContainer && passiveClauseContainer->mayBeAbleToDiscriminateClausesUnderConstructionOnLimits()
                        && passiveClauseContainer->exceedsAgeLimit(numPositiveLiteralsLowerBound, inf, andThatsIt);

  if(hasAgeLimitStrike && andThatsIt) { // we are dealing with purely age-limited container (no need for weight-related investigations)
    env.statistics->discardedNonRedundantClauses++;
    RSTAT_CTR_INC("superpositions skipped for (pure) age limit before building clause");
    return 0;
  }

  if(hasAgeLimitStrike) {
    if(!earlyWeightLimitCheck(eqClause, eqLit, rwClause, rwLit, rwTerm, eqLHS, tgtTerm, subst, eqIsResult, passiveClauseContainer, numPositiveLiteralsLowerBound, inf)) {
      return 0;
    }
  }

  const auto& parRedHandler = _salg->parRedHandler();
  if (!unifier->usesUwa()) {
    if (!parRedHandler.checkSuperposition(eqClause, eqLit, rwClause, rwLit, eqIsResult, subst.ptr())) {
      return 0;
    }
  }

  const Ordering& ordering = _salg->getOrdering();

  TermList tgtTermS = subst->apply(tgtTerm, eqIsResult);

  Literal* rwLitS = subst->apply(rwLit, !eqIsResult);
  TermList rwTermS = subst->apply(rwTerm, !eqIsResult);

  //cout << "Check ordering on " << tgtTermS.toString() << " and " << rwTermS.toString() << endl;

  //check that we're not rewriting smaller subterm with larger
  auto comp = ordering.compare(tgtTermS,rwTermS);
  if(Ordering::isGreaterOrEqual(comp)) {
    return 0;
  }

  if(rwLitS->isEquality()) {
    //check that we're not rewriting only the smaller side of an equality
    TermList arg0=*rwLitS->nthArgument(0);
    TermList arg1=*rwLitS->nthArgument(1);

    if(!arg0.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(ordering.getEqualityArgumentOrder(rwLitS))) {
        return 0;
      }
    } else if(!arg1.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(Ordering::reverse(ordering.getEqualityArgumentOrder(rwLitS)))) {
        return 0;
      }
    }
  }

  if (!unifier->usesUwa()) {
    parRedHandler.insertSuperposition(
      eqClause, rwClause, rwTermS, tgtTermS, eqLHS, rwLitS, eqLit, comp, eqIsResult, subst.ptr());
  }

  Literal* tgtLitS = EqHelper::replace(rwLitS,rwTermS,tgtTermS);

  static bool doSimS = getOptions().simulatenousSuperposition();

  //check we don't create an equational tautology (this happens during self-superposition)
  if(EqHelper::isEqTautology(tgtLitS)) {
    return 0;
  }

  TermList eqLHSS = subst->apply(eqLHS, eqIsResult);

#if VDEBUG
  if(!unifier->usesUwa()){
    ASS_EQ(rwTermS,eqLHSS);
  }
#endif

  Recycled<Stack<Literal*>> res;
  res->reserve(rwLength + eqLength - 1 + unifier->maxNumberOfConstraints());

  bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
  Literal* rwAnsLit = synthesis ? rwClause->getAnswerLiteral() : nullptr;
  Literal* eqAnsLit = synthesis ? eqClause->getAnswerLiteral() : nullptr;
  bool bothHaveAnsLit = (rwAnsLit != nullptr) && (eqAnsLit != nullptr);

  static bool afterCheck = getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete();

  res->push(tgtLitS);
  unsigned weight=tgtLitS->weight();
  for(unsigned i=0;i<rwLength;i++) {
    Literal* curr=(*rwClause)[i];
    if(curr!=rwLit && (!bothHaveAnsLit || curr!=rwAnsLit)) {
      Literal* currAfter = subst->apply(curr, !eqIsResult);

      if (doSimS) {
        currAfter = EqHelper::replace(currAfter,rwTermS,tgtTermS);
      }

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }

      if(hasAgeLimitStrike) {
        weight+=currAfter->weight();
        if(passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
          RSTAT_CTR_INC("superpositions skipped for weight limit while constructing other literals");
          env.statistics->discardedNonRedundantClauses++;
          return nullptr;
        }
      }

      if (afterCheck) {
        TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK)
        if (i < rwClause->numSelected() && ordering.compare(currAfter,rwLitS) == Ordering::GREATER) {
          env.statistics->inferencesBlockedForOrderingAftercheck++;
          return nullptr;
        }
      }

      res->push(currAfter);
    }
  }

  {
    Literal* eqLitS = 0;
    if (afterCheck && eqClause->numSelected() > 1) {
      TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);
      eqLitS = Literal::createEquality(true,eqLHSS,tgtTermS,eqLHSsort);
    }

    for(unsigned i=0;i<eqLength;i++) {
      Literal* curr=(*eqClause)[i];
      if(curr!=eqLit) {
        Literal* currAfter = subst->apply(curr, eqIsResult);

        if(EqHelper::isEqTautology(currAfter)) {
          return nullptr;
        }
        if(hasAgeLimitStrike) {
          weight+=currAfter->weight();
          if(passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
            RSTAT_CTR_INC("superpositions skipped for weight limit while constructing other literals");
            env.statistics->discardedNonRedundantClauses++;
            return nullptr;
          }
        }

        if (eqLitS && i < eqClause->numSelected()) {
          TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);

          Ordering::Result o = ordering.compare(currAfter,eqLitS);

          if (o == Ordering::GREATER || o == Ordering::EQUAL) {
            env.statistics->inferencesBlockedForOrderingAftercheck++;
            return nullptr;
          }
        }

        res->push(currAfter);
      }
    }
  }

  res->loadFromIterator(unifier->computeConstraintLiterals()->iter());

  if (bothHaveAnsLit) {
    Literal* newLitC = subst->apply(rwAnsLit, !eqIsResult);
    Literal* newLitD = subst->apply(eqAnsLit, eqIsResult);
    Literal* condLit = subst->apply(eqLit, eqIsResult);
    res->push(SynthesisALManager::getInstance()->makeITEAnswerLiteral(condLit, newLitC, newLitD));
  }

  if(hasAgeLimitStrike && passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
    RSTAT_CTR_INC("superpositions skipped for weight limit after the clause was built");
    env.statistics->discardedNonRedundantClauses++;
    return nullptr;
  }

  if(!unifier->usesUwa()){
    if(rwClause==eqClause) {
      env.statistics->selfSuperposition++;
    } else if(eqIsResult) {
      env.statistics->forwardSuperposition++;
    } else {
      env.statistics->backwardSuperposition++;
    }
  } else {
    if(rwClause==eqClause) {
      env.statistics->cSelfSuperposition++;
    } else if(eqIsResult) {
      env.statistics->cForwardSuperposition++;
    } else {
      env.statistics->cBackwardSuperposition++;
    }
  }

  inf_destroyer.disable(); // ownership passed to the the clause below
  auto clause = Clause::fromStack(*res, inf);

  if(env.options->proofExtra() == Options::ProofExtra::FULL)
    env.proofExtra.insert(clause, new SuperpositionExtra(
      rwLit,
      eqLit,
      eqLHS,
      rwTerm
    ));

  return clause;
}